

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O1

String * __thiscall
kj::str<char_const(&)[2],kj::StringPtr&,char_const(&)[2],kj::String,char_const(&)[18]>
          (String *__return_storage_ptr__,kj *this,char (*params) [2],StringPtr *params_1,
          char (*params_2) [2],String *params_3,char (*params_4) [18])

{
  char *pcVar1;
  ArrayPtr<const_char> *in_stack_ffffffffffffff78;
  ArrayPtr<const_char> local_80;
  ArrayPtr<const_char> local_70;
  kj *local_60;
  size_t local_58;
  ArrayPtr<const_char> local_50;
  ArrayPtr<const_char> local_40;
  
  local_58 = strlen((char *)this);
  local_70.ptr = *(char **)params;
  local_70.size_ = *(long *)(params + 4) - 1;
  local_60 = this;
  local_80.size_ = strlen((char *)params_1);
  pcVar1 = *(char **)(params_2 + 4);
  local_40.ptr = pcVar1;
  if (pcVar1 != (char *)0x0) {
    local_40.ptr = *(char **)params_2;
  }
  local_40.size_ = (size_t)(char *)0x0;
  if (pcVar1 != (char *)0x0) {
    local_40.size_ = (size_t)(pcVar1 + -1);
  }
  local_80.ptr = (char *)params_1;
  local_50.size_ = strlen((char *)params_3);
  local_50.ptr = (char *)params_3;
  _::
  concat<kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>>
            (__return_storage_ptr__,(_ *)&local_60,&local_70,&local_80,&local_40,&local_50,
             in_stack_ffffffffffffff78);
  return __return_storage_ptr__;
}

Assistant:

String str(Params&&... params) {
  // Magic function which builds a string from a bunch of arbitrary values.  Example:
  //     str(1, " / ", 2, " = ", 0.5)
  // returns:
  //     "1 / 2 = 0.5"
  // To teach `str` how to stringify a type, see `Stringifier`.

  return _::concat(toCharSequence(kj::fwd<Params>(params))...);
}